

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall libtorrent::aux::session_impl::update_i2p_bridge(session_impl *this)

{
  int port;
  ulong uVar1;
  string *hostname;
  session_settings *this_00;
  session_impl *local_60;
  code *local_58;
  undefined8 local_50;
  type local_48;
  undefined1 local_30 [8];
  i2p_session_options session_options;
  error_code ec;
  session_impl *this_local;
  
  session_settings::get_str_abi_cxx11_(&this->m_settings,9);
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = &this->m_settings;
    local_30._0_4_ = session_settings::get_int(this_00,0x4099);
    local_30._4_4_ = session_settings::get_int(this_00,0x409a);
    session_options.m_inbound_quantity = session_settings::get_int(this_00,0x409b);
    session_options.m_outbound_quantity = session_settings::get_int(this_00,0x409c);
    hostname = session_settings::get_str_abi_cxx11_(this_00,9);
    port = session_settings::get_int(this_00,0x407d);
    local_58 = on_i2p_open;
    local_50 = 0;
    local_60 = this;
    ::std::
    bind<void(libtorrent::aux::session_impl::*)(boost::system::error_code_const&),libtorrent::aux::session_impl*,std::_Placeholder<1>const&>
              (&local_48,(offset_in_session_impl_to_subr *)&local_58,&local_60,
               (_Placeholder<1> *)&::std::placeholders::_1);
    i2p_connection::
    open<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(boost::system::error_code_const&)>>
              (&this->m_i2p_conn,hostname,port,(i2p_session_options *)local_30,&local_48);
  }
  else {
    boost::system::error_code::error_code((error_code *)&session_options.m_inbound_length);
    i2p_connection::close(&this->m_i2p_conn,(int)&session_options + 8);
  }
  return;
}

Assistant:

void session_impl::update_i2p_bridge()
	{
		// we need this socket to be open before we
		// can make name lookups for trackers for instance.
		// pause the session now and resume it once we've
		// established the i2p SAM connection
#if TORRENT_USE_I2P
		if (m_settings.get_str(settings_pack::i2p_hostname).empty())
		{
			error_code ec;
			m_i2p_conn.close(ec);
			return;
		}
		TORRENT_ASSERT(!m_abort);
		i2p_session_options session_options{
			m_settings.get_int(settings_pack::i2p_inbound_quantity)
			, m_settings.get_int(settings_pack::i2p_outbound_quantity)
			, m_settings.get_int(settings_pack::i2p_inbound_length)
			, m_settings.get_int(settings_pack::i2p_outbound_length)
		};
		m_i2p_conn.open(m_settings.get_str(settings_pack::i2p_hostname)
			, m_settings.get_int(settings_pack::i2p_port)
			, session_options
			, std::bind(&session_impl::on_i2p_open, this, _1));
#endif
	}